

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestStart
          (PrettyUnitTestResultPrinter *this,TestInfo *test_info)

{
  char *in_RDI;
  char *in_stack_ffffffffffffffd8;
  
  ColoredPrintf(COLOR_GREEN,"[ RUN      ] ");
  String::c_str((String *)(in_RDI + 8));
  TestInfo::name((TestInfo *)0x247368);
  PrintTestName(in_RDI,in_stack_ffffffffffffffd8);
  printf("\n");
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestStart(const TestInfo& test_info) {
  ColoredPrintf(COLOR_GREEN,  "[ RUN      ] ");
  PrintTestName(test_case_name_.c_str(), test_info.name());
  printf("\n");
  fflush(stdout);
}